

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof_data.c
# Opt level: O2

size_t duckdb_je_prof_bt_count(void)

{
  tsd_t *tsd;
  ushort **ppuVar1;
  uint uVar2;
  ulong uVar3;
  long lVar4;
  
  tsd = (tsd_t *)__tls_get_addr(&PTR_027efab8);
  lVar4 = 0;
  duckdb_je_tsd_fetch_slow(tsd,false);
  ppuVar1 = __ctype_b_loc();
  uVar2 = 0;
  do {
    uVar3 = (ulong)uVar2;
    uVar2 = uVar2 + 1;
  } while (((*ppuVar1)[*(char *)(lVar4 + uVar3)] & 0x8001) != 0);
  return 0x16;
}

Assistant:

size_t
prof_bt_count(void) {
	size_t bt_count;
	tsd_t *tsd;
	prof_tdata_t *tdata;

	tsd = tsd_fetch();
	tdata = prof_tdata_get(tsd, false);
	if (tdata == NULL) {
		return 0;
	}

	malloc_mutex_lock(tsd_tsdn(tsd), &bt2gctx_mtx);
	bt_count = ckh_count(&bt2gctx);
	malloc_mutex_unlock(tsd_tsdn(tsd), &bt2gctx_mtx);

	return bt_count;
}